

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswConstr.c
# Opt level: O0

Aig_Man_t * Ssw_FramesWithConstraints(Aig_Man_t *p,int nFrames)

{
  Vec_Ptr_t *p_00;
  int iVar1;
  int iVar2;
  Aig_Man_t *p_01;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *p1;
  int local_40;
  int local_3c;
  int f;
  int i;
  Aig_Obj_t *pObjLo;
  Aig_Obj_t *pObjLi;
  Aig_Obj_t *pObj;
  Aig_Man_t *pFrames;
  int nFrames_local;
  Aig_Man_t *p_local;
  
  iVar1 = Aig_ManRegNum(p);
  if (iVar1 < 1) {
    __assert_fail("Aig_ManRegNum(p) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswConstr.c"
                  ,0x35,"Aig_Man_t *Ssw_FramesWithConstraints(Aig_Man_t *, int)");
  }
  iVar1 = Aig_ManRegNum(p);
  iVar2 = Aig_ManCiNum(p);
  if (iVar2 <= iVar1) {
    __assert_fail("Aig_ManRegNum(p) < Aig_ManCiNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswConstr.c"
                  ,0x36,"Aig_Man_t *Ssw_FramesWithConstraints(Aig_Man_t *, int)");
  }
  iVar1 = Aig_ManObjNumMax(p);
  p_01 = Aig_ManStart(iVar1 * nFrames);
  for (local_3c = 0; iVar1 = Saig_ManRegNum(p), local_3c < iVar1; local_3c = local_3c + 1) {
    p_00 = p->vCis;
    iVar1 = Saig_ManPiNum(p);
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p_00,local_3c + iVar1);
    pAVar4 = Aig_ManConst0(p_01);
    Aig_ObjSetCopy(pAVar3,pAVar4);
  }
  for (local_40 = 0; local_40 < nFrames; local_40 = local_40 + 1) {
    pAVar3 = Aig_ManConst1(p);
    pAVar4 = Aig_ManConst1(p_01);
    Aig_ObjSetCopy(pAVar3,pAVar4);
    for (local_3c = 0; iVar1 = Saig_ManPiNum(p), local_3c < iVar1; local_3c = local_3c + 1) {
      pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p->vCis,local_3c);
      pAVar4 = Aig_ObjCreateCi(p_01);
      Aig_ObjSetCopy(pAVar3,pAVar4);
    }
    for (local_3c = 0; iVar1 = Vec_PtrSize(p->vObjs), local_3c < iVar1; local_3c = local_3c + 1) {
      pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,local_3c);
      if ((pAVar3 != (Aig_Obj_t *)0x0) && (iVar1 = Aig_ObjIsNode(pAVar3), iVar1 != 0)) {
        pAVar4 = Aig_ObjChild0Copy(pAVar3);
        p1 = Aig_ObjChild1Copy(pAVar3);
        pAVar4 = Aig_And(p_01,pAVar4,p1);
        Aig_ObjSetCopy(pAVar3,pAVar4);
      }
    }
    for (local_3c = 0; iVar1 = Vec_PtrSize(p->vCos), local_3c < iVar1; local_3c = local_3c + 1) {
      pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,local_3c);
      pAVar4 = Aig_ObjChild0Copy(pAVar3);
      Aig_ObjSetCopy(pAVar3,pAVar4);
    }
    for (local_3c = 0; iVar1 = Saig_ManPoNum(p), local_3c < iVar1; local_3c = local_3c + 1) {
      pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,local_3c);
      iVar1 = Saig_ManPoNum(p);
      iVar2 = Saig_ManConstrNum(p);
      if (iVar1 - iVar2 <= local_3c) {
        pAVar3 = Aig_ObjCopy(pAVar3);
        pAVar3 = Aig_Not(pAVar3);
        Aig_ObjCreateCo(p_01,pAVar3);
      }
    }
    for (local_3c = 0; iVar1 = Saig_ManRegNum(p), local_3c < iVar1; local_3c = local_3c + 1) {
      pAVar3 = Saig_ManLi(p,local_3c);
      pAVar4 = Saig_ManLo(p,local_3c);
      pAVar3 = Aig_ObjCopy(pAVar3);
      Aig_ObjSetCopy(pAVar4,pAVar3);
    }
  }
  Aig_ManCleanup(p_01);
  return p_01;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Constructs initialized timeframes with constraints as POs.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Aig_Man_t * Ssw_FramesWithConstraints( Aig_Man_t * p, int nFrames )
{
    Aig_Man_t * pFrames;
    Aig_Obj_t * pObj, * pObjLi, * pObjLo;
    int i, f;
//    assert( Saig_ManConstrNum(p) > 0 );
    assert( Aig_ManRegNum(p) > 0 );
    assert( Aig_ManRegNum(p) < Aig_ManCiNum(p) );
    // start the fraig package
    pFrames = Aig_ManStart( Aig_ManObjNumMax(p) * nFrames );
    // create latches for the first frame
    Saig_ManForEachLo( p, pObj, i )
        Aig_ObjSetCopy( pObj, Aig_ManConst0(pFrames) );
    // add timeframes
    for ( f = 0; f < nFrames; f++ )
    {
        // map constants and PIs
        Aig_ObjSetCopy( Aig_ManConst1(p), Aig_ManConst1(pFrames) );
        Saig_ManForEachPi( p, pObj, i )
            Aig_ObjSetCopy( pObj, Aig_ObjCreateCi(pFrames) );
        // add internal nodes of this frame
        Aig_ManForEachNode( p, pObj, i )
            Aig_ObjSetCopy( pObj, Aig_And( pFrames, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) ) );
        // transfer to the primary output
        Aig_ManForEachCo( p, pObj, i )
            Aig_ObjSetCopy( pObj, Aig_ObjChild0Copy(pObj) );
        // create constraint outputs
        Saig_ManForEachPo( p, pObj, i )
        {
            if ( i < Saig_ManPoNum(p) - Saig_ManConstrNum(p) )
                continue;
            Aig_ObjCreateCo( pFrames, Aig_Not( Aig_ObjCopy(pObj) ) );
        }
        // transfer latch inputs to the latch outputs
        Saig_ManForEachLiLo( p, pObjLi, pObjLo, i )
            Aig_ObjSetCopy( pObjLo, Aig_ObjCopy(pObjLi) );
    }
    // remove dangling nodes
    Aig_ManCleanup( pFrames );
    return pFrames;
}